

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClientTimingLog.cpp
# Opt level: O0

void __thiscall
ViconDataStreamSDK::Core::VClientTimingLog::LogLatencies
          (VClientTimingLog *this,ostream *i_rStream,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *i_rHeadings,
          vector<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
          *i_rLatencies)

{
  vector<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
  *this_00;
  bool bVar1;
  __type _Var2;
  EHeadingComparison EVar3;
  reference __lhs;
  size_type sVar4;
  const_reference pvVar5;
  ostream *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Heading;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  uint LatencyIndex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  EHeadingComparison local_2c;
  vector<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
  *pvStack_28;
  EHeadingComparison Result;
  vector<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
  *i_rLatencies_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *i_rHeadings_local;
  ostream *i_rStream_local;
  VClientTimingLog *this_local;
  
  pvStack_28 = i_rLatencies;
  i_rLatencies_local =
       (vector<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
        *)i_rHeadings;
  i_rHeadings_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)i_rStream;
  i_rStream_local = (ostream *)this;
  LogHeadings_abi_cxx11_(&local_48,this,i_rLatencies);
  EVar3 = CompareHeadings(this,i_rHeadings,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  this_00 = i_rLatencies_local;
  if ((int)EVar3 < 2) {
    __range3._0_4_ = 0;
    local_2c = EVar3;
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)i_rLatencies_local);
    Heading = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&Heading), bVar1) {
      __lhs = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end3);
      sVar4 = std::
              vector<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
              ::size(pvStack_28);
      if ((uint)__range3 < sVar4) {
        pvVar5 = std::
                 vector<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
                 ::operator[](pvStack_28,(ulong)(uint)__range3);
        _Var2 = std::operator==(__lhs,&pvVar5->m_Name);
        if (_Var2) {
          this_01 = std::operator<<((ostream *)i_rHeadings_local,", ");
          pvVar5 = std::
                   vector<ViconCGStreamDetail::VLatencyInfo_Sample,_std::allocator<ViconCGStreamDetail::VLatencyInfo_Sample>_>
                   ::operator[](pvStack_28,(ulong)(uint)__range3);
          std::ostream::operator<<(this_01,pvVar5->m_Latency);
          __range3._0_4_ = (uint)__range3 + 1;
        }
        else {
          std::operator<<((ostream *)i_rHeadings_local,", ");
        }
      }
      else {
        std::operator<<((ostream *)i_rHeadings_local,", ");
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void VClientTimingLog::LogLatencies(std::ostream & i_rStream, const std::vector< std::string > & i_rHeadings, const std::vector< ViconCGStreamDetail::VLatencyInfo_Sample >& i_rLatencies) const
{
  EHeadingComparison Result = CompareHeadings( i_rHeadings, LogHeadings( i_rLatencies ) );
  if( Result <= ESubset )
  { 
    unsigned int LatencyIndex = 0;
    for( const auto& Heading : i_rHeadings)
    {
      if(LatencyIndex < i_rLatencies.size() )
      {
        if( Heading == i_rLatencies[ LatencyIndex ].m_Name )
        { 
          i_rStream << ", " << i_rLatencies[ LatencyIndex ].m_Latency;
          ++LatencyIndex;
        }
        else
        {
          i_rStream << ", ";
        }
      }
      else
      {
        i_rStream << ", ";
      }
    }
  }
  // We need a DSSDK error log
  //else
  //{
  //  i_rStream << ", Headings are " << ( Result == ESuperset ) ? "Superset, " : "Different, ";
  //  for (const auto& rHeading : LogHeadings(i_rLatencies))
  //  {
  //    i_rStream << rHeading << ", ";
  //  }
  //}
}